

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

X509 * SSL_get_peer_certificate(SSL *s)

{
  SSL_SESSION *pSVar1;
  
  if (s != (SSL *)0x0) {
    if (*(undefined1 **)(s->packet + 0x10) != bssl::ssl_crypto_x509_method) {
      __assert_fail("ssl == NULL || ssl->ctx->x509_method == &ssl_crypto_x509_method",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                    ,0x26,"void bssl::check_ssl_x509_method(const SSL *)");
    }
    pSVar1 = SSL_get_session(s);
    if ((pSVar1 != (SSL_SESSION *)0x0) &&
       (*(X509 **)(pSVar1->krb5_client_princ + 0x18) != (X509 *)0x0)) {
      X509_up_ref(*(X509 **)(pSVar1->krb5_client_princ + 0x18));
      return *(X509 **)(pSVar1->krb5_client_princ + 0x18);
    }
  }
  return (X509 *)0x0;
}

Assistant:

X509 *SSL_get_peer_certificate(const SSL *ssl) {
  check_ssl_x509_method(ssl);
  if (ssl == NULL) {
    return NULL;
  }
  SSL_SESSION *session = SSL_get_session(ssl);
  if (session == NULL || session->x509_peer == NULL) {
    return NULL;
  }
  X509_up_ref(session->x509_peer);
  return session->x509_peer;
}